

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  lest lVar1;
  expected<InitList,_char> *in_RDX;
  ForNonContainerNonPointer<nonstd::expected_lite::expected<InitList,_char>,_std::string> local_80;
  char *local_60;
  size_type local_58;
  char local_50 [8];
  undefined8 uStack_48;
  undefined1 local_40 [40];
  
  lVar1 = (*(lest **)this)[0x20];
  to_string<nonstd::expected_lite::expected<InitList,char>>(&local_80,*(lest **)this,in_RDX);
  local_58 = local_80._M_string_length;
  local_60 = local_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    uStack_48 = local_80.field_2._8_8_;
  }
  else {
    local_60 = local_80._M_dataplus._M_p;
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_40[0] = lVar1;
  std::__cxx11::string::string((string *)(local_40 + 8),(string *)&local_60);
  result::result(__return_storage_ptr__,(result *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }